

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O3

void GradientFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  
  bVar5 = *data;
  *filtered_data = bVar5;
  if (1 < width) {
    uVar6 = 0;
    do {
      filtered_data[uVar6 + 1] = data[uVar6 + 1] - data[uVar6];
      uVar6 = uVar6 + 1;
    } while (width - 1 != uVar6);
  }
  if (1 < height) {
    puVar7 = filtered_data + stride;
    puVar8 = data + stride;
    iVar4 = 1;
    do {
      bVar1 = data[stride];
      filtered_data[stride] = bVar1 - bVar5;
      if (1 < width) {
        uVar6 = 1;
        bVar5 = bVar1;
        do {
          iVar3 = ((uint)bVar5 + (uint)data[uVar6]) - (uint)data[uVar6 - 1];
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          cVar2 = (char)iVar3;
          if (0xfe < iVar3) {
            cVar2 = -1;
          }
          bVar5 = puVar8[uVar6];
          puVar7[uVar6] = bVar5 - cVar2;
          uVar6 = uVar6 + 1;
        } while ((uint)width != uVar6);
      }
      data = data + stride;
      filtered_data = filtered_data + stride;
      iVar4 = iVar4 + 1;
      puVar7 = puVar7 + stride;
      puVar8 = puVar8 + stride;
      bVar5 = bVar1;
    } while (iVar4 != height);
  }
  return;
}

Assistant:

static void GradientFilter_C(const uint8_t* WEBP_RESTRICT data,
                             int width, int height, int stride,
                             uint8_t* WEBP_RESTRICT filtered_data) {
  DoGradientFilter_C(data, width, height, stride, filtered_data);
}